

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleNoResponse(HttpServerErrorHandler *this,Response *response)

{
  ArrayDisposer **this_00;
  AsyncOutputStream *pAVar1;
  undefined8 *in_RDX;
  ArrayPtr<const_unsigned_char> AVar2;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_138;
  Maybe<unsigned_long> local_128;
  StringPtr local_118;
  undefined1 local_108 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  StringPtr errorMessage;
  undefined1 local_b8 [8];
  HttpHeaders headers;
  HttpHeaderTable headerTable;
  Response *response_local;
  HttpServerErrorHandler *this_local;
  
  this_00 = &headers.ownedStrings.builder.disposer;
  HttpHeaderTable::HttpHeaderTable((HttpHeaderTable *)this_00);
  HttpHeaders::HttpHeaders((HttpHeaders *)local_b8,(HttpHeaderTable *)this_00);
  StringPtr::StringPtr((StringPtr *)&errorMessage.content.size_,"text/plain");
  HttpHeaders::set((HttpHeaders *)local_b8,(HttpHeaderId)(ZEXT416(0xe) << 0x40),
                   (StringPtr)stack0xffffffffffffff18);
  body.ptr = (AsyncOutputStream *)0x941408;
  errorMessage.content.ptr = (char *)0x34;
  StringPtr::StringPtr(&local_118,"Internal Server Error");
  local_138.ptr = (AsyncOutputStream *)StringPtr::size((StringPtr *)&body.ptr);
  Maybe<unsigned_long>::Maybe(&local_128,(unsigned_long *)&local_138.ptr);
  (**(code **)*in_RDX)
            (local_108,in_RDX,500,local_118.content.ptr,local_118.content.size_,local_b8,&local_128)
  ;
  Maybe<unsigned_long>::~Maybe(&local_128);
  pAVar1 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_108);
  AVar2 = StringPtr::asBytes((StringPtr *)&body.ptr);
  (**pAVar1->_vptr_AsyncOutputStream)(&local_138,pAVar1,AVar2.ptr,AVar2.size_);
  mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_108);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,&local_138);
  Promise<void>::~Promise((Promise<void> *)&local_138);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_108);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  HttpHeaderTable::~HttpHeaderTable((HttpHeaderTable *)&headers.ownedStrings.builder.disposer);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleNoResponse(kj::HttpService::Response& response) {
  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  constexpr auto errorMessage = "ERROR: The HttpService did not generate a response."_kj;
  auto body = response.send(500, "Internal Server Error", headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(body));
}